

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O2

wchar_t block_and_read(wchar_t fd,void *buf,size_t len)

{
  int iVar1;
  uint uVar2;
  wchar_t extraout_EAX;
  pollwrapper *pw;
  ssize_t sVar3;
  int *piVar4;
  undefined4 in_register_0000003c;
  char *__assertion;
  
  pw = pollwrap_new();
  do {
    sVar3 = read(0,(void *)CONCAT44(in_register_0000003c,fd),0x1f);
    if ((-1 < (int)sVar3) || (piVar4 = __errno_location(), *piVar4 != 0xb)) {
LAB_00115263:
      pollwrap_free(pw);
      return extraout_EAX;
    }
    pollwrap_clear(pw);
    pollwrap_add_fd_rwx(pw,0,1);
    while( true ) {
      iVar1 = pollwrap_poll_endless(pw);
      if (-1 < iVar1) break;
      if (*piVar4 != 4) goto LAB_00115263;
    }
    if (iVar1 == 0) {
      __assertion = "ret != 0";
      uVar2 = 0x5d;
      goto LAB_0011528a;
    }
    uVar2 = pollwrap_get_fd_rwx(pw,0);
    if ((uVar2 & 1) == 0) {
      __assertion = "pollwrap_check_fd_rwx(pw, fd, SELECT_R)";
      uVar2 = 0x62;
LAB_0011528a:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/console.c"
                    ,uVar2,"int block_and_read(int, void *, size_t)");
    }
  } while( true );
}

Assistant:

static int block_and_read(int fd, void *buf, size_t len)
{
    int ret;
    pollwrapper *pw = pollwrap_new();

    while ((ret = read(fd, buf, len)) < 0 && (
#ifdef EAGAIN
               (errno == EAGAIN) ||
#endif
#ifdef EWOULDBLOCK
               (errno == EWOULDBLOCK) ||
#endif
               false)) {

        pollwrap_clear(pw);
        pollwrap_add_fd_rwx(pw, fd, SELECT_R);
        do {
            ret = pollwrap_poll_endless(pw);
        } while (ret < 0 && errno == EINTR);
        assert(ret != 0);
        if (ret < 0) {
            pollwrap_free(pw);
            return ret;
        }
        assert(pollwrap_check_fd_rwx(pw, fd, SELECT_R));
    }

    pollwrap_free(pw);
    return ret;
}